

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O0

void sample_output<trng::mrg2>(mrg2 *r,string *name)

{
  result_type rVar1;
  ulong uVar2;
  ostream *poVar3;
  mrg2 *in_RSI;
  int i;
  int local_14;
  
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (0x1f < uVar2) break;
    std::__cxx11::string::operator+=((string *)in_RSI,' ');
  }
  std::operator<<((ostream *)&std::cout,(string *)in_RSI);
  for (local_14 = 0; local_14 < 0xf; local_14 = local_14 + 1) {
    rVar1 = trng::mrg2::operator()(in_RSI);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar1);
    std::operator<<(poVar3,'\t');
  }
  rVar1 = trng::mrg2::operator()(in_RSI);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar1);
  std::operator<<(poVar3,'\n');
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}